

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  string_view local_58;
  string local_48;
  ResultType local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  FuncDeclaration *decl_local;
  CWriter *this_local;
  
  local_20 = name;
  name_local = (string *)decl;
  decl_local = (FuncDeclaration *)this;
  ResultType::ResultType(&local_28,&(decl->sig).result_types);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::ResultType,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,&local_28,(char (*) [2])0x353a7b,local_20,(char (*) [2])0x36256a);
  (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&local_48,(CWriter *)this);
  (anonymous_namespace)::CWriter::Write<std::__cxx11::string,char_const(&)[2]>
            ((CWriter *)this,&local_48,(char (*) [2])0x36451d);
  std::__cxx11::string::~string((string *)&local_48);
  WriteParamTypes(this,(FuncDeclaration *)name_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,")");
  Write(this,local_58);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(ResultType(decl.sig.result_types), " ", name, "(");
  Write(ModuleInstanceTypeName(), "*");
  WriteParamTypes(decl);
  Write(")");
}